

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_copyCCtx(ZSTD_CCtx *dstCCtx,ZSTD_CCtx *srcCCtx,unsigned_long_long pledgedSrcSize)

{
  size_t sVar1;
  ZSTD_buffered_policy_e zbuff;
  ZSTD_frameParameters fParams;
  unsigned_long_long pledgedSrcSize_local;
  ZSTD_CCtx *srcCCtx_local;
  ZSTD_CCtx *dstCCtx_local;
  
  fParams._4_8_ = pledgedSrcSize;
  if (pledgedSrcSize == 0) {
    fParams.checksumFlag = -1;
    fParams.noDictIDFlag = -1;
  }
  sVar1 = ZSTD_copyCCtx_internal
                    (dstCCtx,srcCCtx,(ZSTD_frameParameters)ZEXT112(fParams._4_8_ != -1),
                     fParams._4_8_,srcCCtx->bufferedPolicy);
  return sVar1;
}

Assistant:

size_t ZSTD_copyCCtx(ZSTD_CCtx* dstCCtx, const ZSTD_CCtx* srcCCtx, unsigned long long pledgedSrcSize)
{
    ZSTD_frameParameters fParams = { 1 /*content*/, 0 /*checksum*/, 0 /*noDictID*/ };
    ZSTD_buffered_policy_e const zbuff = srcCCtx->bufferedPolicy;
    ZSTD_STATIC_ASSERT((U32)ZSTDb_buffered==1);
    if (pledgedSrcSize==0) pledgedSrcSize = ZSTD_CONTENTSIZE_UNKNOWN;
    fParams.contentSizeFlag = (pledgedSrcSize != ZSTD_CONTENTSIZE_UNKNOWN);

    return ZSTD_copyCCtx_internal(dstCCtx, srcCCtx,
                                fParams, pledgedSrcSize,
                                zbuff);
}